

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O0

LY_ERR lys_print_module(ly_out *out,lys_module *module,LYS_OUTFORMAT format,size_t line_length,
                       uint32_t options)

{
  LY_ERR local_38;
  LY_ERR ret;
  uint32_t options_local;
  size_t line_length_local;
  LYS_OUTFORMAT format_local;
  lys_module *module_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","lys_print_module");
    out_local._4_4_ = LY_EINVAL;
  }
  else if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module",
           "lys_print_module");
    out_local._4_4_ = LY_EINVAL;
  }
  else {
    out->func_printed = 0;
    switch(format) {
    case LYS_OUT_YANG:
      if (module->parsed == (lysp_module *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" parsed module missing.",module->name);
        local_38 = LY_EINVAL;
      }
      else {
        local_38 = yang_print_parsed_module(out,module->parsed,options);
      }
      break;
    case LYS_OUT_YANG_COMPILED:
      if (module->compiled == (lysc_module *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" compiled module missing.",module->name)
        ;
        local_38 = LY_EINVAL;
      }
      else {
        local_38 = yang_print_compiled(out,module,options);
      }
      break;
    case LYS_OUT_YIN:
      if (module->parsed == (lysp_module *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" parsed module missing.",module->name);
        local_38 = LY_EINVAL;
      }
      else {
        local_38 = yin_print_parsed_module(out,module->parsed,options);
      }
      break;
    case LYS_OUT_TREE:
      if (module->parsed == (lysp_module *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" parsed module missing.",module->name);
        local_38 = LY_EINVAL;
      }
      else {
        local_38 = tree_print_module(out,module,options,line_length);
      }
      break;
    default:
      ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Unsupported output format.");
      local_38 = LY_EINVAL;
    }
    out_local._4_4_ = local_38;
  }
  return out_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_module(struct ly_out *out, const struct lys_module *module, LYS_OUTFORMAT format, size_t line_length,
        uint32_t options)
{
    LY_ERR ret;

    LY_CHECK_ARG_RET(NULL, out, module, LY_EINVAL);

    /* reset number of printed bytes */
    out->func_printed = 0;

    switch (format) {
    case LYS_OUT_YANG:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yang_print_parsed_module(out, module->parsed, options);
        break;
    case LYS_OUT_YANG_COMPILED:
        if (!module->compiled) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" compiled module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yang_print_compiled(out, module, options);
        break;
    case LYS_OUT_YIN:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yin_print_parsed_module(out, module->parsed, options);
        break;
    case LYS_OUT_TREE:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }
        ret = tree_print_module(out, module, options, line_length);
        break;
    default:
        LOGERR(module->ctx, LY_EINVAL, "Unsupported output format.");
        ret = LY_EINVAL;
        break;
    }

    return ret;
}